

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_config.cxx
# Opt level: O2

ptr<cluster_config> __thiscall
nuraft::cluster_config::deserialize(cluster_config *this,buffer_serializer *bs)

{
  ulong uVar1;
  int32_t iVar2;
  void *pvVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<cluster_config> pVar4;
  bool ec;
  ulong prev_log_idx;
  ulong log_idx;
  string user_ctx;
  size_t ctx_len;
  uint64_t local_78;
  uint64_t local_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  size_t local_38;
  
  local_70 = buffer_serializer::get_u64(bs);
  local_78 = buffer_serializer::get_u64(bs);
  buffer_serializer::get_u8(bs);
  pvVar3 = buffer_serializer::get_bytes(bs,&stack0xffffffffffffffc8);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,pvVar3,local_38 + (long)pvVar3)
  ;
  iVar2 = buffer_serializer::get_i32(bs);
  std::make_shared<nuraft::cluster_config,unsigned_long&,unsigned_long&,bool&>
            (&this->log_idx_,&local_70,(bool *)&local_78);
  for (; uVar1 = this->log_idx_, 0 < iVar2; iVar2 = iVar2 + -1) {
    srv_config::deserialize((srv_config *)&stack0xffffffffffffffb8,bs);
    std::__cxx11::
    list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
    ::push_back((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                 *)(uVar1 + 0x38),(value_type *)&stack0xffffffffffffffb8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
  }
  std::__cxx11::string::_M_assign((string *)(uVar1 + 0x18));
  std::__cxx11::string::~string((string *)local_68);
  pVar4.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar4.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<cluster_config>)
         pVar4.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<cluster_config> cluster_config::deserialize(buffer_serializer& bs) {
    ulong log_idx = bs.get_u64();
    ulong prev_log_idx = bs.get_u64();

    byte ec_byte = bs.get_u8();
    bool ec = ec_byte ? true : false;

    size_t ctx_len;
    const byte* ctx_data = (const byte*)bs.get_bytes(ctx_len);
    std::string user_ctx = std::string((const char*)ctx_data, ctx_len);

    int32 cnt = bs.get_i32();
    ptr<cluster_config> conf = cs_new<cluster_config>(log_idx, prev_log_idx, ec);
    while (cnt -- > 0) {
        conf->get_servers().push_back(srv_config::deserialize(bs));
    }

    conf->set_user_ctx(user_ctx);

    return conf;
}